

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckEqualsWithStringsFailsOnDifferentStrings::RunImpl
          (TestCheckEqualsWithStringsFailsOnDifferentStrings *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  char txt2 [6];
  char txt1 [6];
  TestResults results;
  int local_70 [2];
  char local_68 [8];
  char local_60 [8];
  TestDetails local_58;
  TestResults local_38;
  
  builtin_strncpy(local_60,"Hello",6);
  builtin_strncpy(local_68,"Hallo",6);
  UnitTest::TestResults::TestResults(&local_38,(TestReporter *)0x0);
  UnitTest::TestDetails::TestDetails(&local_58,"","","",0);
  UnitTest::CheckEqual(&local_38,local_60,local_68,&local_58);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_70[1] = 1;
  local_70[0] = UnitTest::TestResults::GetFailureCount(&local_38);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar2,0x17);
  UnitTest::CheckEqual<int,int>(results_00,local_70 + 1,local_70,&local_58);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}